

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

int __thiscall
DiskGen::LoadDisk(DiskGen *this,DataContainer *container,ILoadingProgress *loading_progress)

{
  uint uVar1;
  size_type sVar2;
  reference ppIVar3;
  undefined1 local_40 [8];
  vector<IDisk_*,_std::allocator<IDisk_*>_> disk_list;
  ILoadingProgress *loading_progress_local;
  DataContainer *container_local;
  DiskGen *this_local;
  
  disk_list.super__Vector_base<IDisk_*,_std::allocator<IDisk_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)loading_progress;
  (*(this->super_ITypeManager)._vptr_ITypeManager[0xc])
            (local_40,this,container,loading_progress,this->log_);
  sVar2 = std::vector<IDisk_*,_std::allocator<IDisk_*>_>::size
                    ((vector<IDisk_*,_std::allocator<IDisk_*>_> *)local_40);
  if (sVar2 == 0) {
    this_local._4_4_ = -1;
  }
  else {
    (*(this->super_ITypeManager)._vptr_ITypeManager[0xb])();
    ppIVar3 = std::vector<IDisk_*,_std::allocator<IDisk_*>_>::operator[]
                        ((vector<IDisk_*,_std::allocator<IDisk_*>_> *)local_40,0);
    this->disk_ = *ppIVar3;
    IDisk::SetFixedSpeed(this->disk_,(bool)(this->fixed_speed_ & 1));
    IDisk::SetLog(this->disk_,this->log_);
    this->current_side_ = 0;
    uVar1 = (*this->disk_->_vptr_IDisk[0xe])(this->disk_,0);
    if (uVar1 <= this->current_track_) {
      this->current_track_ = 0;
    }
    this->disk_present_ = true;
    this_local._4_4_ = 0;
  }
  std::vector<IDisk_*,_std::allocator<IDisk_*>_>::~vector
            ((vector<IDisk_*,_std::allocator<IDisk_*>_> *)local_40);
  return this_local._4_4_;
}

Assistant:

int DiskGen::LoadDisk(DataContainer* container, ILoadingProgress* loading_progress)
{
   // Get proper IDisk
   std::vector<IDisk*> disk_list = CreateDisk(container, loading_progress, log_);

   // Load
   if (disk_list.size() == 0) return -1;

   CleanDisk();
   disk_ = disk_list[0];

   disk_->SetFixedSpeed(fixed_speed_);
   disk_->SetLog(log_);
   current_side_ = 0;

   // Juste check there is enough tracks...
   if (disk_->GetNumberOfTracks(0) <= current_track_)
      current_track_ = 0;

   disk_present_ = true;


   return 0;
}